

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::getTestMoreStuff
          (TestInterfaceImpl *this,GetTestMoreStuffContext context)

{
  _func_int **params;
  int **ppiVar1;
  Fault local_b0;
  int *local_a8;
  int *_kj_result;
  Client local_90 [2];
  Maybe<capnp::MessageSize> local_60;
  Builder local_48;
  CallContextHook *local_20;
  TestInterfaceImpl *this_local;
  GetTestMoreStuffContext context_local;
  
  local_20 = context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffParams,_capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>
  ::getResults(&local_48,
               (CallContext<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffParams,_capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>
                *)&this_local,&local_60);
  params = context.hook[1]._vptr_CallContextHook;
  local_a8 = kj::_::readMaybe<int>((Maybe<int_&> *)(context.hook + 2));
  if (local_a8 != (int *)0x0) {
    ppiVar1 = kj::mv<int*>(&local_a8);
    kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>((kj *)&_kj_result,(int *)params,*ppiVar1);
    capnproto_test::capnp::test::TestMoreStuff::Client::Client<capnp::_::TestMoreStuffImpl,void>
              (local_90,(Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)&_kj_result);
    capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults::Builder::setCap
              (&local_48,local_90);
    capnproto_test::capnp::test::TestMoreStuff::Client::~Client(local_90);
    kj::Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t>::~Own
              ((Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)&_kj_result);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault
            (&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x3a5,FAILED,"handleCount != nullptr","");
  kj::_::Debug::Fault::fatal(&local_b0);
}

Assistant:

kj::Promise<void> TestInterfaceImpl::getTestMoreStuff(GetTestMoreStuffContext context) {
  context.getResults().setCap(
      kj::heap<TestMoreStuffImpl>(callCount, KJ_REQUIRE_NONNULL(handleCount)));
  return kj::READY_NOW;
}